

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void Fl_X::make_xid(Fl_Window *win,XVisualInfo *visual,Colormap colormap)

{
  uint uVar1;
  Fl_Group *pFVar2;
  int iVar3;
  __pid_t _Var4;
  int iVar5;
  Fl_Window *pFVar6;
  long lVar7;
  Window WVar8;
  Fl_X *pFVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  byte *pbVar13;
  uint *puVar14;
  uint mh;
  int my;
  uint uVar15;
  uint mw;
  bool bVar16;
  int scr_h;
  int sh;
  int local_4d0;
  int local_4cc;
  int local_4c8;
  int local_4c4;
  Window local_4c0;
  long pid;
  XVisualInfo *local_4b0;
  int scr_y;
  long local_4a0;
  undefined8 local_490;
  undefined4 local_488;
  uint local_468 [2];
  undefined8 local_460;
  uint local_450 [2];
  Window local_448;
  int scr_x;
  long local_430;
  long local_428;
  long local_420;
  
  local_4c0 = colormap;
  Fl_Group::current((Fl_Group *)0x0);
  iVar5 = (win->super_Fl_Group).super_Fl_Widget.x_;
  my = (win->super_Fl_Group).super_Fl_Widget.y_;
  mw = (win->super_Fl_Group).super_Fl_Widget.w_;
  if ((int)mw < 2) {
    mw = 1;
  }
  uVar1 = (win->super_Fl_Group).super_Fl_Widget.h_;
  mh = 1;
  if (1 < (int)uVar1) {
    mh = uVar1;
  }
  if (Fl::grab_ == (Fl_Window *)0x0 &&
      (win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    Fl::screen_xywh(&scr_x,&scr_y,(int *)&pid,&scr_h,iVar5,my,mw,mh);
    if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 8) == 0) {
      iVar3 = ~mw + (int)pid + scr_x;
      if ((int)(mw + iVar5) < (int)pid + scr_x) {
        iVar3 = iVar5;
      }
      iVar5 = scr_x + 1;
      if (scr_x < iVar3) {
        iVar5 = iVar3;
      }
      iVar3 = ~mh + scr_h + scr_y;
      if ((int)(mh + my) < scr_h + scr_y) {
        iVar3 = my;
      }
      my = scr_y + 0x14;
      if (scr_y <= iVar3 + -0x14) {
        my = iVar3;
      }
    }
    iVar3 = ((int)pid + scr_x) - mw;
    if ((int)(iVar5 + mw) <= (int)pid + scr_x) {
      iVar3 = iVar5;
    }
    iVar5 = iVar3;
    if (iVar3 <= scr_x) {
      iVar5 = scr_x;
    }
    iVar3 = (scr_h + scr_y) - mh;
    if ((int)(my + mh) <= scr_h + scr_y) {
      iVar3 = my;
    }
    my = iVar3;
    if (iVar3 <= scr_y) {
      my = scr_y;
    }
  }
  if (((win->super_Fl_Group).super_Fl_Widget.parent_ != (Fl_Group *)0x0) &&
     (pFVar6 = Fl_Widget::window((Fl_Widget *)win), pFVar6->i == (Fl_X *)0x0)) {
    puVar14 = &(win->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar14 = (byte)*puVar14 & 0xfd;
    return;
  }
  local_4d0 = Fl_Window::fullscreen_screen_top;
  local_4c4 = Fl_Window::fullscreen_screen_right;
  local_4cc = Fl_Window::fullscreen_screen_bottom;
  local_4c8 = Fl_Window::fullscreen_screen_left;
  local_4b0 = visual;
  if ((Fl_Window::fullscreen_screen_top | Fl_Window::fullscreen_screen_bottom |
       Fl_Window::fullscreen_screen_left | Fl_Window::fullscreen_screen_right) < 0) {
    local_4d0 = Fl::screen_num(iVar5,my,mw,mh);
    local_4c4 = local_4d0;
    local_4cc = local_4d0;
    local_4c8 = local_4d0;
  }
  if ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    pFVar9 = (Fl_X *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10);
  }
  else {
    pFVar6 = Fl_Widget::window((Fl_Widget *)win);
    pFVar9 = pFVar6->i;
    if (pFVar9 == (Fl_X *)0x0) {
      WVar8 = 0;
      goto LAB_001e4426;
    }
  }
  WVar8 = pFVar9->xid;
LAB_001e4426:
  local_460 = 0x8000;
  if ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) {
    local_460 = 0x62c07f;
  }
  local_448 = local_4c0;
  local_490 = 0;
  local_488 = 0;
  uVar1 = (win->super_Fl_Group).super_Fl_Widget.flags_;
  bVar16 = (uVar1 >> 8 & 1) != 0;
  if (bVar16) {
    puVar14 = local_468;
    local_450[0] = 1;
    uVar15 = 0x2e18;
  }
  else {
    puVar14 = local_450;
    uVar15 = 0x2818;
  }
  *puVar14 = (uint)bVar16;
  if (Fl::grab_ != (Fl_Window *)0x0) {
    local_468[0] = 1;
    if ((uVar1 & 8) == 0) {
      uVar15 = uVar15 | 0x400;
    }
    else {
      local_450[0] = 1;
      uVar15 = 0x2e18;
    }
  }
  if (((uVar1 >> 0x12 & 1) != 0) &&
     (local_4c0 = WVar8, iVar3 = ewmh_supported(), WVar8 = local_4c0, iVar3 == 0)) {
    local_450[0] = 1;
    uVar15 = uVar15 | 0x200;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4c8);
    iVar5 = scr_x;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4c4);
    mw = (scr_x - iVar5) + scr_h;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4d0);
    my = (int)pid;
    Fl::screen_xywh(&scr_x,(int *)&pid,&scr_h,&sh,local_4cc);
    mh = ((int)pid - my) + sh;
    WVar8 = local_4c0;
  }
  lVar7 = (long)fl_background_pixel;
  if (-1 < lVar7) {
    fl_background_pixel = -1;
    uVar15 = uVar15 | 2;
    local_4a0 = lVar7;
  }
  WVar8 = XCreateWindow(fl_display,WVar8,iVar5,my,mw,mh,0,local_4b0->depth,1,local_4b0->visual,
                        uVar15,&scr_y);
  pFVar9 = set_xid(win,WVar8);
  bVar16 = false;
  XSetWMProperties(fl_display,pFVar9->xid,0,0,0,0,0,0,0);
  _Var4 = getpid();
  pid = (long)_Var4;
  XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_PID,6,0x20,0,&pid,1);
  if (((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0) && (local_450[0] == 0)) {
    Fl_Window::label(win,(win->super_Fl_Group).super_Fl_Widget.label_.value,win->iconlabel_);
    XChangeProperty(fl_display,pFVar9->xid,WM_PROTOCOLS,4,0x20,0,&WM_DELETE_WINDOW,1);
    sendxjunk(pFVar9);
    pcVar10 = Fl_Window::xclass(win);
    if (pcVar10 != (char *)0x0) {
      pcVar10 = Fl_Window::xclass(win);
      sVar11 = strlen(pcVar10);
      strcpy((char *)&scr_x,pcVar10);
      strcpy((char *)((long)&scr_x + (long)(int)sVar11 + 1),pcVar10);
      lVar7 = (long)((sVar11 << 0x20) + 0x100000000) >> 0x20;
      iVar5 = toupper((int)*(char *)((long)&scr_x + lVar7));
      *(char *)((long)&scr_x + lVar7) = (char)iVar5;
      if ((char)iVar5 == 'X') {
        lVar7 = (long)((sVar11 << 0x20) + 0x200000000) >> 0x20;
        iVar5 = toupper((int)*(char *)((long)&scr_x + lVar7));
        *(char *)((long)&scr_x + lVar7) = (char)iVar5;
      }
      XChangeProperty(fl_display,pFVar9->xid,0x43,0x1f,8,0,&scr_x,(int)sVar11 * 2 + 2);
    }
    bVar16 = true;
    if (((((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x4020) != 0) &&
        (pFVar9->next != (Fl_X *)0x0)) && (fl_disable_transient_for == 0)) {
      pFVar6 = pFVar9->next->w;
      pFVar2 = (pFVar6->super_Fl_Group).super_Fl_Widget.parent_;
      while (pFVar2 != (Fl_Group *)0x0) {
        pFVar6 = Fl_Widget::window((Fl_Widget *)pFVar6);
        pFVar2 = (pFVar6->super_Fl_Group).super_Fl_Widget.parent_;
      }
      if (pFVar6->i == (Fl_X *)0x0) {
        WVar8 = 0;
      }
      else {
        WVar8 = pFVar6->i->xid;
      }
      XSetTransientForHint(fl_display,pFVar9->xid,WVar8);
      bVar16 = ((pFVar6->super_Fl_Group).super_Fl_Widget.flags_ & 2) == 0;
      if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x4000) != 0) {
        uVar12 = XInternAtom(fl_display,"_NET_WM_STATE",0);
        _scr_x = XInternAtom(fl_display,"_NET_WM_STATE_MODAL",0);
        XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,2,&scr_x,1);
      }
    }
    if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 8) != 0) {
      uVar12 = XInternAtom(fl_display,"_NET_WM_STATE",0);
      _scr_x = XInternAtom(fl_display,"_NET_WM_STATE_SKIP_TASKBAR",0);
      XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,2,&scr_x,1);
    }
    if ((((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0) &&
       (iVar5 = ewmh_supported(), iVar5 != 0)) {
      _scr_x = (long)local_4d0;
      local_430 = (long)local_4cc;
      local_428 = (long)local_4c8;
      local_420 = (long)local_4c4;
      XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_FULLSCREEN_MONITORS,4,0x20,0,&scr_x,4);
      XChangeProperty(fl_display,pFVar9->xid,fl_NET_WM_STATE,4,0x20,2,&fl_NET_WM_STATE_FULLSCREEN,1)
      ;
    }
    _scr_x = 4;
    XChangeProperty(fl_display,pFVar9->xid,fl_XdndAware,4,0x20,0,&scr_x,1);
    pbVar13 = (byte *)XAllocWMHints();
    pbVar13[8] = 1;
    pbVar13[9] = 0;
    pbVar13[10] = 0;
    pbVar13[0xb] = 0;
    pbVar13[0] = 1;
    pbVar13[1] = 0;
    pbVar13[2] = 0;
    pbVar13[3] = 0;
    pbVar13[4] = 0;
    pbVar13[5] = 0;
    pbVar13[6] = 0;
    pbVar13[7] = 0;
    if (fl_show_iconic != '\0') {
      pbVar13[0] = 3;
      pbVar13[1] = 0;
      pbVar13[2] = 0;
      pbVar13[3] = 0;
      pbVar13[4] = 0;
      pbVar13[5] = 0;
      pbVar13[6] = 0;
      pbVar13[7] = 0;
      pbVar13[0xc] = 3;
      pbVar13[0xd] = 0;
      pbVar13[0xe] = 0;
      pbVar13[0xf] = 0;
      fl_show_iconic = '\0';
      bVar16 = false;
    }
    if (*(long *)win->icon_ != 0) {
      *(long *)(pbVar13 + 0x10) = *(long *)win->icon_;
      *pbVar13 = *pbVar13 | 4;
    }
    XSetWMHints(fl_display,pFVar9->xid,pbVar13);
    XFree(pbVar13);
    set_icons(pFVar9);
    bVar16 = !bVar16;
  }
  if (((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x3000) != 0) {
    uVar12 = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE",0);
    _scr_x = XInternAtom(fl_display,"_NET_WM_WINDOW_TYPE_MENU",0);
    XChangeProperty(fl_display,pFVar9->xid,uVar12,4,0x20,0,&scr_x,1);
  }
  if ((have_xfixes == '\x01') && ((win->super_Fl_Group).super_Fl_Widget.parent_ == (Fl_Group *)0x0))
  {
    XFixesSelectSelectionInput(fl_display,pFVar9->xid,1,1);
    XFixesSelectSelectionInput(fl_display,pFVar9->xid,CLIPBOARD,1);
  }
  if (Fl_Window::shape_data_ != (shape_data_type *)0x0) {
    Fl_Window::combine_mask(win);
  }
  XMapWindow(fl_display,pFVar9->xid);
  if (!bVar16) {
    puVar14 = &(win->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar14 = (byte)*puVar14 & 0xfd;
    iVar5 = Fl::e_number;
    Fl::e_number = 0x10;
    (*(win->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(win,0x10);
    Fl::e_number = iVar5;
    Fl_Widget::redraw((Fl_Widget *)win);
  }
  if ((((win->super_Fl_Group).super_Fl_Widget.flags_ & 0x40000) != 0) &&
     (iVar5 = ewmh_supported(), iVar5 == 0)) {
    XGrabKeyboard(fl_display,pFVar9->xid,1,1,1,fl_event_time);
  }
  return;
}

Assistant:

void Fl_X::make_xid(Fl_Window* win, XVisualInfo *visual, Colormap colormap)
{
  Fl_Group::current(0); // get rid of very common user bug: forgot end()

  int X = win->x();
  int Y = win->y();
  int W = win->w();
  if (W <= 0) W = 1; // X don't like zero...
  int H = win->h();
  if (H <= 0) H = 1; // X don't like zero...
  if (!win->parent() && !Fl::grab()) {
    // center windows in case window manager does not do anything:
#ifdef FL_CENTER_WINDOWS
    if (!win->force_position()) {
      win->x(X = scr_x+(scr_w-W)/2);
      win->y(Y = scr_y+(scr_h-H)/2);
    }
#endif // FL_CENTER_WINDOWS

    // force the window to be on-screen.  Usually the X window manager
    // does this, but a few don't, so we do it here for consistency:
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h, X, Y, W, H);

    if (win->border()) {
      // ensure border is on screen:
      // (assume extremely minimal dimensions for this border)
      const int top = 20;
      const int left = 1;
      const int right = 1;
      const int bottom = 1;
      if (X+W+right > scr_x+scr_w) X = scr_x+scr_w-right-W;
      if (X-left < scr_x) X = scr_x+left;
      if (Y+H+bottom > scr_y+scr_h) Y = scr_y+scr_h-bottom-H;
      if (Y-top < scr_y) Y = scr_y+top;
    }
    // now insure contents are on-screen (more important than border):
    if (X+W > scr_x+scr_w) X = scr_x+scr_w-W;
    if (X < scr_x) X = scr_x;
    if (Y+H > scr_y+scr_h) Y = scr_y+scr_h-H;
    if (Y < scr_y) Y = scr_y;
  }

  // if the window is a subwindow and our parent is not mapped yet, we
  // mark this window visible, so that mapping the parent at a later
  // point in time will call this function again to finally map the subwindow.
  if (win->parent() && !Fl_X::i(win->window())) {
    win->set_visible();
    return;
  }

  // Compute which screen(s) we should be on if we want to go fullscreen
  int fullscreen_top, fullscreen_bottom, fullscreen_left, fullscreen_right;

  fullscreen_top = win->fullscreen_screen_top;
  fullscreen_bottom = win->fullscreen_screen_bottom;
  fullscreen_left = win->fullscreen_screen_left;
  fullscreen_right = win->fullscreen_screen_right;

  if ((fullscreen_top < 0) || (fullscreen_bottom < 0) ||
      (fullscreen_left < 0) || (fullscreen_right < 0)) {
    fullscreen_top = Fl::screen_num(X, Y, W, H);
    fullscreen_bottom = fullscreen_top;
    fullscreen_left = fullscreen_top;
    fullscreen_right = fullscreen_top;
  }


  ulong root = win->parent() ?
    fl_xid(win->window()) : RootWindow(fl_display, fl_screen);

  XSetWindowAttributes attr;
  int mask = CWBorderPixel|CWColormap|CWEventMask|CWBitGravity;
  attr.event_mask = win->parent() ? childEventMask : XEventMask;
  attr.colormap = colormap;
  attr.border_pixel = 0;
  attr.bit_gravity = 0; // StaticGravity;
  if (win->override()) {
    attr.override_redirect = 1;
    attr.save_under = 1;
    mask |= CWOverrideRedirect | CWSaveUnder;
  } else attr.override_redirect = 0;
  if (Fl::grab()) {
    attr.save_under = 1; mask |= CWSaveUnder;
    if (!win->border()) {attr.override_redirect = 1; mask |= CWOverrideRedirect;}
  }
  // For the non-EWMH fullscreen case, we cannot use the code above,
  // since we do not want save_under, do not want to turn off the
  // border, and cannot grab without an existing window. Besides, 
  // there is no clear_override(). 
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    int sx, sy, sw, sh;
    attr.override_redirect = 1;
    mask |= CWOverrideRedirect;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_left);
    X = sx;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_right);
    W = sx + sw - X;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_top);
    Y = sy;
    Fl::screen_xywh(sx, sy, sw, sh, fullscreen_bottom);
    H = sy + sh - Y;
  }

  if (fl_background_pixel >= 0) {
    attr.background_pixel = fl_background_pixel;
    fl_background_pixel = -1;
    mask |= CWBackPixel;
  }

  Fl_X* xp =
    set_xid(win, XCreateWindow(fl_display,
                               root,
                               X, Y, W, H,
                               0, // borderwidth
                               visual->depth,
                               InputOutput,
                               visual->visual,
                               mask, &attr));
  int showit = 1;

  // Set WM_CLIENT_MACHINE and WM_LOCALE_NAME
  XSetWMProperties(fl_display, xp->xid, NULL, NULL, NULL, 0, NULL, NULL, NULL);

  // Set _NET_WM_PID
  long pid;
  pid = getpid();
  XChangeProperty(fl_display, xp->xid, fl_NET_WM_PID,
		  XA_CARDINAL, 32, 0, (unsigned char *)&pid, 1);

  if (!win->parent() && !attr.override_redirect) {
    // Communicate all kinds 'o junk to the X Window Manager:

    win->label(win->label(), win->iconlabel());

    XChangeProperty(fl_display, xp->xid, WM_PROTOCOLS,
                    XA_ATOM, 32, 0, (uchar*)&WM_DELETE_WINDOW, 1);

    // send size limits and border:
    xp->sendxjunk();

    // set the class property, which controls the icon used:
    if (win->xclass()) {
      char buffer[1024];
      const char *xclass = win->xclass();
      const int len = strlen(xclass);
      // duplicate the xclass string for use as XA_WM_CLASS
      strcpy(buffer, xclass);
      strcpy(buffer + len + 1, xclass);
      // create the capitalized version:
      buffer[len + 1] = toupper(buffer[len + 1]);
      if (buffer[len + 1] == 'X')
        buffer[len + 2] = toupper(buffer[len + 2]);
      XChangeProperty(fl_display, xp->xid, XA_WM_CLASS, XA_STRING, 8, 0,
                      (unsigned char *)buffer, len * 2 + 2);
    }

    if (win->non_modal() && xp->next && !fl_disable_transient_for) {
      // find some other window to be "transient for":
      Fl_Window* wp = xp->next->w;
      while (wp->parent()) wp = wp->window();
      XSetTransientForHint(fl_display, xp->xid, fl_xid(wp));
      if (!wp->visible()) showit = 0; // guess that wm will not show it
      if (win->modal()) {
        Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
        Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_MODAL", 0);
        XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
            PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
      }
    }

    // Make sure that borderless windows do not show in the task bar
    if (!win->border()) {
      Atom net_wm_state = XInternAtom (fl_display, "_NET_WM_STATE", 0);
      Atom net_wm_state_skip_taskbar = XInternAtom (fl_display, "_NET_WM_STATE_SKIP_TASKBAR", 0);
      XChangeProperty (fl_display, xp->xid, net_wm_state, XA_ATOM, 32,
          PropModeAppend, (unsigned char*) &net_wm_state_skip_taskbar, 1);
    }

    // If asked for, create fullscreen
    if (win->fullscreen_active() && Fl_X::ewmh_supported()) {
      unsigned long data[4];
      data[0] = fullscreen_top;
      data[1] = fullscreen_bottom;
      data[2] = fullscreen_left;
      data[3] = fullscreen_right;
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_FULLSCREEN_MONITORS, XA_ATOM, 32,
                       PropModeReplace, (unsigned char*) data, 4);
      XChangeProperty (fl_display, xp->xid, fl_NET_WM_STATE, XA_ATOM, 32,
                       PropModeAppend, (unsigned char*) &fl_NET_WM_STATE_FULLSCREEN, 1);
    }

    // Make it receptive to DnD:
    long version = 4;
    XChangeProperty(fl_display, xp->xid, fl_XdndAware,
                    XA_ATOM, sizeof(int)*8, 0, (unsigned char*)&version, 1);

    XWMHints *hints = XAllocWMHints();
    hints->input = True;
    hints->flags = InputHint;
    if (fl_show_iconic) {
      hints->flags |= StateHint;
      hints->initial_state = IconicState;
      fl_show_iconic = 0;
      showit = 0;
    }
    if (win->icon_->legacy_icon) {
      hints->icon_pixmap = (Pixmap)win->icon_->legacy_icon;
      hints->flags       |= IconPixmapHint;
    }
    XSetWMHints(fl_display, xp->xid, hints);
    XFree(hints);

    xp->set_icons();
  }

  // set the window type for menu and tooltip windows to avoid animations (compiz)
  if (win->menu_window() || win->tooltip_window()) {
    Atom net_wm_type = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE", False);
    Atom net_wm_type_kind = XInternAtom(fl_display, "_NET_WM_WINDOW_TYPE_MENU", False);
    XChangeProperty(fl_display, xp->xid, net_wm_type, XA_ATOM, 32, PropModeReplace, (unsigned char*)&net_wm_type_kind, 1);
  }

#if HAVE_XFIXES
  // register for clipboard change notifications
  if (have_xfixes && !win->parent()) {
    XFixesSelectSelectionInput(fl_display, xp->xid, XA_PRIMARY,
                               XFixesSetSelectionOwnerNotifyMask);
    XFixesSelectSelectionInput(fl_display, xp->xid, CLIPBOARD,
                               XFixesSetSelectionOwnerNotifyMask);
  }
#endif

  if (win->shape_data_) {
    win->combine_mask();
    }
  XMapWindow(fl_display, xp->xid);
  if (showit) {
    win->set_visible();
    int old_event = Fl::e_number;
    win->handle(Fl::e_number = FL_SHOW); // get child windows to appear
    Fl::e_number = old_event;
    win->redraw();
  }

  // non-EWMH fullscreen case, need grab
  if (win->fullscreen_active() && !Fl_X::ewmh_supported()) {
    XGrabKeyboard(fl_display, xp->xid, 1, GrabModeAsync, GrabModeAsync, fl_event_time);
  }

}